

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Program.cpp
# Opt level: O0

Module * __thiscall
soul::Program::ProgramImpl::insert(ProgramImpl *this,int index,Module *newModule)

{
  pool_ref<soul::Module> local_40;
  __normal_iterator<soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
  local_38;
  __normal_iterator<soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
  local_30;
  const_iterator local_28;
  Module *local_20;
  Module *newModule_local;
  ProgramImpl *pPStack_10;
  int index_local;
  ProgramImpl *this_local;
  
  local_20 = newModule;
  newModule_local._4_4_ = index;
  pPStack_10 = this;
  if (index < 0) {
    std::vector<soul::pool_ref<soul::Module>,std::allocator<soul::pool_ref<soul::Module>>>::
    emplace_back<soul::Module&>
              ((vector<soul::pool_ref<soul::Module>,std::allocator<soul::pool_ref<soul::Module>>> *)
               &this->modules,newModule);
  }
  else {
    local_38._M_current =
         (pool_ref<soul::Module> *)
         std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>::
         begin(&this->modules);
    local_30 = __gnu_cxx::
               __normal_iterator<soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
               ::operator+(&local_38,(long)newModule_local._4_4_);
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::Module>const*,std::vector<soul::pool_ref<soul::Module>,std::allocator<soul::pool_ref<soul::Module>>>>
    ::__normal_iterator<soul::pool_ref<soul::Module>*>
              ((__normal_iterator<soul::pool_ref<soul::Module>const*,std::vector<soul::pool_ref<soul::Module>,std::allocator<soul::pool_ref<soul::Module>>>>
                *)&local_28,&local_30);
    pool_ref<soul::Module>::pool_ref<soul::Module,void>(&local_40,local_20);
    std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>::
    insert(&this->modules,local_28,&local_40);
    pool_ref<soul::Module>::~pool_ref(&local_40);
  }
  return local_20;
}

Assistant:

Module& insert (int index, Module& newModule)
    {
        if (index < 0)
            modules.emplace_back (newModule);
        else
            modules.insert (modules.begin() + index, newModule);

        return newModule;
    }